

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O1

word zzDivW(word *q,word *a,size_t n,word w)

{
  size_t sVar1;
  word wVar2;
  word wVar3;
  
  if (n == 0) {
    wVar3 = 0;
  }
  else {
    wVar3 = 0;
    do {
      sVar1 = n - 1;
      wVar2 = a[n - 1];
      wVar3 = __udivti3(wVar2,wVar3,w,0);
      q[n - 1] = wVar3;
      wVar3 = wVar2 - wVar3 * w;
      n = sVar1;
    } while (sVar1 != 0);
  }
  return wVar3;
}

Assistant:

word zzDivW(word q[], const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsSameOrDisjoint(a, q, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		q[n] = (word)(divisor / w);
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}